

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Vec_Wec_t * Gia_ManCollectTopmost(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,int nFaddMin)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vChain;
  int *piVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  void *__s;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  
  vChain = (Vec_Int_t *)malloc(0x10);
  vChain->nCap = 100;
  vChain->nSize = 0;
  piVar6 = (int *)malloc(400);
  vChain->pArray = piVar6;
  iVar2 = vFadds->nSize >> 0x1f;
  iVar5 = vFadds->nSize / 5 + iVar2;
  uVar10 = iVar5 - iVar2;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < (iVar5 - iVar2) - 1U) {
    uVar9 = uVar10;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar9;
  if (uVar9 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)(int)uVar9,0x10);
  }
  pVVar7->pArray = pVVar8;
  iVar5 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
  if (iVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 * 4);
  }
  uVar10 = iVar5 * 0x20;
  memset(__s,0,(long)iVar5 << 2);
  uVar9 = vFadds->nSize;
  if (4 < (long)(int)uVar9) {
    uVar11 = 0;
    do {
      if ((ulong)(long)(int)uVar9 <= uVar11) {
LAB_005da2a9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = vFadds->pArray[uVar11];
      if (((long)iVar2 < 0) || (vMap->nSize <= iVar2)) goto LAB_005da2a9;
      uVar3 = vMap->pArray[iVar2];
      if (-1 < (int)uVar3) {
        if ((int)uVar10 <= (int)uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      }
      uVar11 = uVar11 + 5;
    } while (((ulong)uVar9 / 5) * 5 != uVar11);
  }
  Gia_ManIncrementTravId(p);
  if (4 < vFadds->nSize) {
    uVar11 = 0;
    if (iVar5 * 0x20 < 1) {
      uVar10 = 0;
    }
    do {
      uVar9 = (uint)uVar11;
      if (uVar9 == uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((*(uint *)((long)__s + (uVar11 >> 5) * 4) >> (uVar9 & 0x1f) & 1) == 0) {
        Gia_ManCollectOneChain(p,vFadds,uVar9,vMap,vChain);
        uVar3 = vChain->nSize;
        if (nFaddMin <= (int)uVar3) {
          uVar12 = pVVar7->nCap;
          uVar4 = pVVar7->nSize;
          if (uVar4 == uVar12) {
            lVar13 = (long)(int)uVar12;
            if ((int)uVar12 < 0x10) {
              if (pVVar7->pArray == (Vec_Int_t *)0x0) {
                pVVar8 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                pVVar8 = (Vec_Int_t *)realloc(pVVar7->pArray,0x100);
              }
              pVVar7->pArray = pVVar8;
              memset(pVVar8 + lVar13,0,(0x10 - lVar13) * 0x10);
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar12 * 2;
              if (iVar5 <= (int)uVar12) goto LAB_005da123;
              if (pVVar7->pArray == (Vec_Int_t *)0x0) {
                pVVar8 = (Vec_Int_t *)malloc((ulong)uVar12 << 5);
              }
              else {
                pVVar8 = (Vec_Int_t *)realloc(pVVar7->pArray,(ulong)uVar12 << 5);
              }
              pVVar7->pArray = pVVar8;
              memset(pVVar8 + lVar13,0,lVar13 * 0x10);
            }
            pVVar7->nCap = iVar5;
          }
LAB_005da123:
          pVVar7->nSize = uVar4 + 1;
          if ((int)uVar4 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          if (0 < (int)uVar3) {
            pVVar8 = pVVar7->pArray;
            piVar6 = vChain->pArray;
            uVar11 = 0;
            do {
              Vec_IntPush(pVVar8 + ((ulong)(uVar4 + 1) - 1),piVar6[uVar11]);
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
          }
          if (0 < (int)uVar3) {
            piVar6 = vChain->pArray;
            uVar11 = 0;
            do {
              iVar5 = piVar6[uVar11];
              if (iVar5 < 0) goto LAB_005da2a9;
              uVar12 = iVar5 * 5 + 3;
              if (vFadds->nSize <= (int)uVar12) goto LAB_005da2a9;
              iVar2 = vFadds->pArray[uVar12];
              if (p->nTravIdsAlloc <= iVar2) {
LAB_005da2c8:
                __assert_fail("Id < p->nTravIdsAlloc",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
              }
              if (p->pTravIds[iVar2] == p->nTravIds) {
                __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3))",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                              ,0x20b,
                              "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                             );
              }
              uVar12 = iVar5 * 5 + 4;
              if (vFadds->nSize <= (int)uVar12) goto LAB_005da2a9;
              iVar5 = vFadds->pArray[uVar12];
              if (p->nTravIdsAlloc <= iVar5) goto LAB_005da2c8;
              if (p->pTravIds[iVar5] == p->nTravIds) {
                __assert_fail("!Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4))",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                              ,0x20c,
                              "Vec_Wec_t *Gia_ManCollectTopmost(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                             );
              }
              Gia_ManMarkWithTravId_rec(p,iVar2);
              if (vFadds->nSize <= (int)uVar12) goto LAB_005da2a9;
              Gia_ManMarkWithTravId_rec(p,vFadds->pArray[uVar12]);
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
          }
        }
      }
      uVar11 = (ulong)(uVar9 + 1);
    } while ((int)(uVar9 + 1) < vFadds->nSize / 5);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (vChain->pArray != (int *)0x0) {
    free(vChain->pArray);
    vChain->pArray = (int *)0x0;
  }
  free(vChain);
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManCollectTopmost( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, int nFaddMin )
{
    int i, j, iFadd;
    Vec_Int_t * vChain  = Vec_IntAlloc( 100 );
    Vec_Wec_t * vChains = Vec_WecAlloc( Vec_IntSize(vFadds)/5 );
    // erase elements appearing as FADD inputs
    Vec_Bit_t * vMarksTop = Vec_BitStart( Vec_IntSize(vFadds)/5 );
    Dtc_ForEachFadd( vFadds, i )
        if ( (iFadd = Vec_IntEntry(vMap, Vec_IntEntry(vFadds, 5*i+0))) >= 0 )
            Vec_BitWriteEntry( vMarksTop, iFadd, 1 );
    // compress the remaining ones
    Gia_ManIncrementTravId( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        if ( Vec_BitEntry(vMarksTop, i) )
            continue;
        Gia_ManCollectOneChain( p, vFadds, i, vMap, vChain );
        if ( Vec_IntSize(vChain) < nFaddMin )
            continue;
        Vec_IntAppend( Vec_WecPushLevel(vChains), vChain );
        Vec_IntForEachEntry( vChain, iFadd, j )
        {
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+3)) );
            assert( !Gia_ObjIsTravIdCurrentId(p, Vec_IntEntry(vFadds, 5*iFadd+4)) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
            Gia_ManMarkWithTravId_rec( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
        }
    }
    // cleanup
    Vec_BitFree( vMarksTop );
    Vec_IntFree( vChain );
    return vChains;
}